

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::computePrimalActivity
          (SPxLPBase<double> *this,VectorBase<double> *primal,VectorBase<double> *activity,
          bool unscaled)

{
  double dVar1;
  pointer pdVar2;
  undefined4 uVar3;
  SPxInternalCodeException *pSVar4;
  undefined7 in_register_00000009;
  int iVar5;
  ulong uVar6;
  Item *pIVar7;
  ulong uVar8;
  int n;
  long lVar9;
  allocator local_5d;
  undefined4 local_5c;
  DSVectorBase<double> tmp;
  
  pdVar2 = (primal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(primal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar2) >> 3;
  iVar5 = (int)uVar6;
  if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum != iVar5) {
    pSVar4 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&tmp,
               "XSPXLP01 Primal vector for computing row activity has wrong dimension",&local_5d);
    SPxInternalCodeException::SPxInternalCodeException(pSVar4,(string *)&tmp);
    __cxa_throw(pSVar4,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  local_5c = (undefined4)CONCAT71(in_register_00000009,unscaled);
  n = (int)((ulong)((long)(activity->val).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 3);
  if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum == n) {
    uVar8 = 0;
    uVar6 = uVar6 & 0xffffffff;
    if (iVar5 < 1) {
      uVar6 = uVar8;
    }
    lVar9 = 8;
    while( true ) {
      if (-uVar8 == uVar6) {
        VectorBase<double>::clear(activity);
        return;
      }
      dVar1 = *(double *)((long)pdVar2 + lVar9 + -8);
      if ((dVar1 != 0.0) || (NAN(dVar1))) break;
      lVar9 = lVar9 + 8;
      uVar8 = uVar8 - 1;
    }
    DSVectorBase<double>::DSVectorBase(&tmp,n);
    if (((char)local_5c == '\0') || (this->_isScaled != true)) {
      pIVar7 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
               *(int *)((long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                       + lVar9 + -4);
    }
    else {
      (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,-uVar8 & 0xffffffff,&tmp);
      pIVar7 = (Item *)&tmp.super_SVectorBase<double>;
    }
    VectorBase<double>::operator=(activity,(SVectorBase<double> *)pIVar7);
    uVar6 = -uVar8;
    VectorBase<double>::operator*=
              (activity,(primal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + -uVar8);
    uVar3 = local_5c;
    while (uVar6 = uVar6 + 1,
          (int)uVar6 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
      pdVar2 = (primal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((*(double *)((long)pdVar2 + lVar9) != 0.0) || (NAN(*(double *)((long)pdVar2 + lVar9)))) {
        if (((char)uVar3 == '\0') || (this->_isScaled != true)) {
          pIVar7 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                   (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar6].idx;
        }
        else {
          (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,uVar6 & 0xffffffff,&tmp);
          pdVar2 = (primal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pIVar7 = (Item *)&tmp.super_SVectorBase<double>;
        }
        VectorBase<double>::multAdd<double,double>
                  (activity,(double *)((long)pdVar2 + lVar9),(SVectorBase<double> *)pIVar7);
      }
      lVar9 = lVar9 + 8;
    }
    DSVectorBase<double>::~DSVectorBase(&tmp);
    return;
  }
  pSVar4 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&tmp,"XSPXLP03 Activity vector computing row activity has wrong dimension",
             &local_5d);
  SPxInternalCodeException::SPxInternalCodeException(pSVar4,(string *)&tmp);
  __cxa_throw(pSVar4,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
}

Assistant:

inline
void SPxLPBase<R>::computePrimalActivity(const VectorBase<R>& primal, VectorBase<R>& activity,
      const bool unscaled) const
{
   if(primal.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP01 Primal vector for computing row activity has wrong dimension");

   if(activity.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP03 Activity vector computing row activity has wrong dimension");

   int c;

   for(c = 0; c < nCols() && primal[c] == 0; c++)
      ;

   if(c >= nCols())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nRows());

   if(unscaled && _isScaled)
   {
      lp_scaler->getColUnscaled(*this, c, tmp);
      activity = tmp;
   }
   else
      activity = colVector(c);

   activity *= primal[c];
   c++;

   for(; c < nCols(); c++)
   {
      if(primal[c] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getColUnscaled(*this, c, tmp);
            activity.multAdd(primal[c], tmp);
         }
         else
            activity.multAdd(primal[c], colVector(c));
      }
   }
}